

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

uint __thiscall PacketReader::GetNumber(PacketReader *this,size_t length)

{
  uchar b1;
  uchar b2;
  uchar b3;
  unsigned_long __n;
  uint uVar1;
  unsigned_long *puVar2;
  iterator __result;
  reference pvVar3;
  size_t local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  array<unsigned_char,_4UL> local_1c;
  size_t sStack_18;
  array<unsigned_char,_4UL> bytes;
  size_t length_local;
  PacketReader *this_local;
  
  local_1c._M_elems[0] = 0xfe;
  local_1c._M_elems[1] = 0xfe;
  local_1c._M_elems[2] = 0xfe;
  local_1c._M_elems[3] = 0xfe;
  sStack_18 = length;
  local_30._M_current = (char *)std::cbegin<std::__cxx11::string>(&this->data);
  local_28 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_30,this->pos);
  local_38 = Remaining(this);
  puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffe8,&local_38);
  __n = *puVar2;
  __result = std::begin<std::array<unsigned_char,4ul>>(&local_1c);
  std::
  copy_n<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,unsigned_char*>
            (local_28,__n,__result);
  this->pos = sStack_18 + this->pos;
  pvVar3 = std::array<unsigned_char,_4UL>::operator[](&local_1c,0);
  b1 = *pvVar3;
  pvVar3 = std::array<unsigned_char,_4UL>::operator[](&local_1c,1);
  b2 = *pvVar3;
  pvVar3 = std::array<unsigned_char,_4UL>::operator[](&local_1c,2);
  b3 = *pvVar3;
  pvVar3 = std::array<unsigned_char,_4UL>::operator[](&local_1c,3);
  uVar1 = PacketProcessor::Number(b1,b2,b3,*pvVar3);
  return uVar1;
}

Assistant:

unsigned int PacketReader::GetNumber(std::size_t length)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};

	std::copy_n(util::cbegin(this->data) + this->pos, std::min(length, this->Remaining()), util::begin(bytes));

	this->pos += length;

	return PacketProcessor::Number(bytes[0], bytes[1], bytes[2], bytes[3]);
}